

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode resolve_server(Curl_easy *data,connectdata *conn,_Bool *async)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  resolve_t rVar5;
  timediff_t tVar6;
  char *pcVar7;
  curltime cVar8;
  curltime newer;
  curltime older;
  int local_74;
  hostname *local_70;
  proxy_info *local_68;
  char *local_50;
  char *unix_path;
  char *pcStack_40;
  int rc;
  char *peertype;
  timediff_t timeout_ms;
  hostname *ehost;
  _Bool *async_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  tVar6 = Curl_timeleft(data,(curltime *)0x0,true);
  pcStack_40 = "host";
  local_50 = conn->unix_domain_socket;
  if ((((local_50 == (char *)0x0) && (((ulong)conn->bits >> 4 & 1) != 0)) &&
      ((conn->socks_proxy).host.name != (char *)0x0)) &&
     (iVar4 = strncmp("localhost/",(conn->socks_proxy).host.name,10), iVar4 == 0)) {
    local_50 = (conn->socks_proxy).host.name + 9;
  }
  if (local_50 == (char *)0x0) {
    if (((ulong)conn->bits >> 4 & 1) == 0) {
      if (((ulong)conn->bits >> 8 & 1) == 0) {
        local_70 = &conn->host;
      }
      else {
        local_70 = &conn->conn_to_host;
      }
      timeout_ms = (timediff_t)local_70;
      if (((ulong)conn->bits >> 9 & 1) == 0) {
        local_74 = conn->remote_port;
      }
      else {
        local_74 = conn->conn_to_port;
      }
      (conn->primary).remote_port = local_74;
    }
    else {
      if (((ulong)conn->bits >> 1 & 1) == 0) {
        local_68 = &conn->http_proxy;
      }
      else {
        local_68 = &conn->socks_proxy;
      }
      timeout_ms = (timediff_t)local_68;
      pcStack_40 = "proxy";
    }
    pcVar7 = (*Curl_cstrdup)(*(char **)(timeout_ms + 0x10));
    conn->hostname_resolve = pcVar7;
    if (conn->hostname_resolve == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      rVar5 = Curl_resolv_timeout(data,conn->hostname_resolve,(conn->primary).remote_port,
                                  &conn->dns_entry,tVar6);
      if (rVar5 == CURLRESOLV_PENDING) {
        *async = true;
      }
      else {
        if (rVar5 == CURLRESOLV_TIMEDOUT) {
          uVar1 = *(undefined8 *)(timeout_ms + 0x18);
          cVar8 = Curl_now();
          uVar2 = (data->progress).t_startsingle.tv_sec;
          uVar3 = (data->progress).t_startsingle.tv_usec;
          older.tv_usec = uVar3;
          older.tv_sec = uVar2;
          newer._12_4_ = 0;
          newer.tv_sec = SUB128(cVar8._0_12_,0);
          newer.tv_usec = SUB124(cVar8._0_12_,8);
          older._12_4_ = 0;
          tVar6 = Curl_timediff(newer,older);
          Curl_failf(data,"Failed to resolve %s \'%s\' with timeout after %ld ms",pcStack_40,uVar1,
                     tVar6);
          return CURLE_OPERATION_TIMEDOUT;
        }
        if (conn->dns_entry == (Curl_dns_entry *)0x0) {
          Curl_failf(data,"Could not resolve %s: %s",pcStack_40,*(undefined8 *)(timeout_ms + 0x18));
          return CURLE_COULDNT_RESOLVE_HOST;
        }
      }
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    conn->transport = '\x06';
    data_local._4_4_ = resolve_unix(data,conn,local_50);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode resolve_server(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool *async)
{
  struct hostname *ehost;
  timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);
  const char *peertype = "host";
  int rc;
#ifdef USE_UNIX_SOCKETS
  char *unix_path = conn->unix_domain_socket;

#ifndef CURL_DISABLE_PROXY
  if(!unix_path && CONN_IS_PROXIED(conn) && conn->socks_proxy.host.name &&
     !strncmp(UNIX_SOCKET_PREFIX"/",
              conn->socks_proxy.host.name, sizeof(UNIX_SOCKET_PREFIX)))
    unix_path = conn->socks_proxy.host.name + sizeof(UNIX_SOCKET_PREFIX) - 1;
#endif

  if(unix_path) {
    /* TODO, this only works if previous transport is TRNSPRT_TCP. Check it? */
    conn->transport = TRNSPRT_UNIX;
    return resolve_unix(data, conn, unix_path);
  }
#endif

  DEBUGASSERT(conn->dns_entry == NULL);

#ifndef CURL_DISABLE_PROXY
  if(CONN_IS_PROXIED(conn)) {
    ehost = conn->bits.socksproxy ? &conn->socks_proxy.host :
      &conn->http_proxy.host;
    peertype = "proxy";
  }
  else
#endif
  {
    ehost = conn->bits.conn_to_host ? &conn->conn_to_host : &conn->host;
    /* If not connecting via a proxy, extract the port from the URL, if it is
     * there, thus overriding any defaults that might have been set above. */
    conn->primary.remote_port = conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
  }

  /* Resolve target host right on */
  conn->hostname_resolve = strdup(ehost->name);
  if(!conn->hostname_resolve)
    return CURLE_OUT_OF_MEMORY;

  rc = Curl_resolv_timeout(data, conn->hostname_resolve,
                           conn->primary.remote_port,
                           &conn->dns_entry, timeout_ms);
  if(rc == CURLRESOLV_PENDING)
    *async = TRUE;
  else if(rc == CURLRESOLV_TIMEDOUT) {
    failf(data, "Failed to resolve %s '%s' with timeout after %"
          FMT_TIMEDIFF_T " ms", peertype, ehost->dispname,
          Curl_timediff(Curl_now(), data->progress.t_startsingle));
    return CURLE_OPERATION_TIMEDOUT;
  }
  else if(!conn->dns_entry) {
    failf(data, "Could not resolve %s: %s", peertype, ehost->dispname);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  return CURLE_OK;
}